

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O2

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  storage_type *psVar1;
  QWidget *pQVar2;
  QGridLayout *pQVar3;
  QMarkdownTextEdit *this_00;
  QMenuBar *this_01;
  QToolBar *this_02;
  QStatusBar *this_03;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QArrayDataPointer<char16_t> local_48;
  
  QObject::objectName();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (local_48.size == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("MainWindow",0xb);
    QVar4.m_data = psVar1;
    QVar4.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar4);
    QObject::setObjectName((QString *)MainWindow);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QWidget::resize((QWidget *)MainWindow,0x42e,0x347);
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("QMarkdownTextEdit",0x12);
  QVar5.m_data = psVar1;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  QWidget::setWindowTitle((QString *)MainWindow);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  pQVar2 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar2,MainWindow,0);
  this->centralWidget = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("centralWidget",0xe);
  QVar6.m_data = psVar1;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  pQVar3 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar3,this->centralWidget);
  this->gridLayout = pQVar3;
  (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,6);
  QLayout::setContentsMargins((int)this->gridLayout,0xb,0xb,0xb);
  pQVar3 = this->gridLayout;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("gridLayout",0xb);
  QVar7.m_data = psVar1;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  this_00 = (QMarkdownTextEdit *)operator_new(0x98);
  QMarkdownTextEdit::QMarkdownTextEdit(this_00,this->centralWidget,true);
  this->textEdit = this_00;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("textEdit",9);
  QVar8.m_data = psVar1;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QGridLayout::addWidget(this->gridLayout,this->textEdit,0,0,1,1,0);
  QMainWindow::setCentralWidget((QWidget *)MainWindow);
  this_01 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(this_01,(QWidget *)MainWindow);
  this->menuBar = this_01;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("menuBar",8);
  QVar9.m_data = psVar1;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x160000042d;
  QWidget::setGeometry((QRect *)this->menuBar);
  QMainWindow::setMenuBar((QMenuBar *)MainWindow);
  this_02 = (QToolBar *)operator_new(0x28);
  QToolBar::QToolBar(this_02,(QWidget *)MainWindow);
  this->mainToolBar = this_02;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("mainToolBar",0xc);
  QVar10.m_data = psVar1;
  QVar10.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QMainWindow::addToolBar((ToolBarArea)MainWindow,(QToolBar *)0x4);
  this_03 = (QStatusBar *)operator_new(0x28);
  QStatusBar::QStatusBar(this_03,(QWidget *)MainWindow);
  this->statusBar = this_03;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("statusBar",10);
  QVar11.m_data = psVar1;
  QVar11.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)this_03);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QMainWindow::setStatusBar((QStatusBar *)MainWindow);
  retranslateUi(this,MainWindow);
  QMetaObject::connectSlotsByName((QObject *)MainWindow);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(1070, 839);
        MainWindow->setWindowTitle(QString::fromUtf8("QMarkdownTextEdit"));
        centralWidget = new QWidget(MainWindow);
        centralWidget->setObjectName(QString::fromUtf8("centralWidget"));
        gridLayout = new QGridLayout(centralWidget);
        gridLayout->setSpacing(6);
        gridLayout->setContentsMargins(11, 11, 11, 11);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        textEdit = new QMarkdownTextEdit(centralWidget);
        textEdit->setObjectName(QString::fromUtf8("textEdit"));

        gridLayout->addWidget(textEdit, 0, 0, 1, 1);

        MainWindow->setCentralWidget(centralWidget);
        menuBar = new QMenuBar(MainWindow);
        menuBar->setObjectName(QString::fromUtf8("menuBar"));
        menuBar->setGeometry(QRect(0, 0, 1070, 23));
        MainWindow->setMenuBar(menuBar);
        mainToolBar = new QToolBar(MainWindow);
        mainToolBar->setObjectName(QString::fromUtf8("mainToolBar"));
        MainWindow->addToolBar(Qt::TopToolBarArea, mainToolBar);
        statusBar = new QStatusBar(MainWindow);
        statusBar->setObjectName(QString::fromUtf8("statusBar"));
        MainWindow->setStatusBar(statusBar);

        retranslateUi(MainWindow);

        QMetaObject::connectSlotsByName(MainWindow);
    }